

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_stats.cpp
# Opt level: O2

void duckdb::ListStats::Verify
               (BaseStatistics *stats,Vector *vector,SelectionVector *sel,idx_t count)

{
  sel_t *psVar1;
  BaseStatistics *this;
  Vector *vector_00;
  idx_t iVar2;
  idx_t iVar3;
  idx_t iVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  SelectionVector list_sel;
  UnifiedVectorFormat vdata;
  SelectionVector local_90;
  UnifiedVectorFormat local_78;
  
  this = GetChildStats(stats);
  vector_00 = ListVector::GetEntry(vector);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(vector,count,&local_78);
  iVar2 = 0;
  for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
    iVar4 = iVar3;
    if (sel->sel_vector != (sel_t *)0x0) {
      iVar4 = (idx_t)sel->sel_vector[iVar3];
    }
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      iVar4 = (idx_t)(local_78.sel)->sel_vector[iVar4];
    }
    if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar4 >> 6] >>
         (iVar4 & 0x3f) & 1) != 0)) {
      iVar2 = iVar2 + *(long *)(local_78.data + iVar4 * 0x10 + 8);
    }
  }
  SelectionVector::SelectionVector(&local_90,iVar2);
  psVar1 = sel->sel_vector;
  iVar2 = 0;
  for (iVar3 = 0; iVar3 != count; iVar3 = iVar3 + 1) {
    iVar4 = iVar3;
    if (psVar1 != (sel_t *)0x0) {
      iVar4 = (idx_t)psVar1[iVar3];
    }
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      iVar4 = (idx_t)(local_78.sel)->sel_vector[iVar4];
    }
    uVar5 = *(ulong *)(local_78.data + iVar4 * 0x10);
    lVar6 = *(long *)(local_78.data + iVar4 * 0x10 + 8);
    if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar4 >> 6] >>
         (iVar4 & 0x3f) & 1) != 0)) {
      while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
        local_90.sel_vector[iVar2] = (sel_t)uVar5;
        iVar2 = iVar2 + 1;
        uVar5 = (ulong)((sel_t)uVar5 + 1);
      }
    }
  }
  BaseStatistics::Verify(this,vector_00,&local_90,iVar2);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_90.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return;
}

Assistant:

void ListStats::Verify(const BaseStatistics &stats, Vector &vector, const SelectionVector &sel, idx_t count) {
	auto &child_stats = ListStats::GetChildStats(stats);
	auto &child_entry = ListVector::GetEntry(vector);
	UnifiedVectorFormat vdata;
	vector.ToUnifiedFormat(count, vdata);

	auto list_data = UnifiedVectorFormat::GetData<list_entry_t>(vdata);
	idx_t total_list_count = 0;
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		auto index = vdata.sel->get_index(idx);
		auto list = list_data[index];
		if (vdata.validity.RowIsValid(index)) {
			for (idx_t list_idx = 0; list_idx < list.length; list_idx++) {
				total_list_count++;
			}
		}
	}
	SelectionVector list_sel(total_list_count);
	idx_t list_count = 0;
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		auto index = vdata.sel->get_index(idx);
		auto list = list_data[index];
		if (vdata.validity.RowIsValid(index)) {
			for (idx_t list_idx = 0; list_idx < list.length; list_idx++) {
				list_sel.set_index(list_count++, list.offset + list_idx);
			}
		}
	}

	child_stats.Verify(child_entry, list_sel, list_count);
}